

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O3

cmFileSetVisibility cmFileSetVisibilityFromName(string_view name,cmMakefile *mf)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string msg;
  string local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t local_28;
  long *local_20;
  undefined8 local_18;
  char *local_10;
  
  local_20 = (long *)name._M_str;
  local_28 = name._M_len;
  if (local_28 == 6) {
    if (*(short *)((long)local_20 + 4) == 0x4349 && (int)*local_20 == 0x4c425550) {
      return Public;
    }
  }
  else if (local_28 == 7) {
    if (*(int *)((long)local_20 + 3) == 0x45544156 && (int)*local_20 == 0x56495250) {
      return Private;
    }
  }
  else if ((local_28 == 9) && ((char)local_20[1] == 'E' && *local_20 == 0x4341465245544e49)) {
    return Interface;
  }
  local_38._M_len = 0x15;
  local_38._M_str = "File set visibility \"";
  local_18 = 0xf;
  local_10 = "\" is not valid.";
  views._M_len = 3;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_(&local_58,views);
  if (mf == (cmMakefile *)0x0) {
    cmSystemTools::Error(&local_58);
  }
  else {
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return Private;
}

Assistant:

cmFileSetVisibility cmFileSetVisibilityFromName(cm::string_view name,
                                                cmMakefile* mf)
{
  if (name == "INTERFACE"_s) {
    return cmFileSetVisibility::Interface;
  }
  if (name == "PUBLIC"_s) {
    return cmFileSetVisibility::Public;
  }
  if (name == "PRIVATE"_s) {
    return cmFileSetVisibility::Private;
  }
  auto msg = cmStrCat("File set visibility \"", name, "\" is not valid.");
  if (mf) {
    mf->IssueMessage(MessageType::FATAL_ERROR, msg);
  } else {
    cmSystemTools::Error(msg);
  }
  return cmFileSetVisibility::Private;
}